

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O2

void * QXcbEglNativeInterfaceHandler::eglDisplayForWindow(QWindow *window)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  
  cVar1 = QSurface::supportsOpenGL();
  if (cVar1 != '\0') {
    lVar2 = QWindow::handle();
    if (lVar2 == 0) {
      pvVar3 = eglDisplay();
      return pvVar3;
    }
  }
  cVar1 = QSurface::supportsOpenGL();
  if (cVar1 == '\0') {
    pvVar3 = (void *)0x0;
  }
  else {
    lVar2 = QWindow::handle();
    pvVar3 = *(void **)(*(long *)(lVar2 + 0xe0) + 0x18);
  }
  return pvVar3;
}

Assistant:

void *QXcbEglNativeInterfaceHandler::eglDisplayForWindow(QWindow *window)
{
    Q_ASSERT(window);
    if (window->supportsOpenGL() && window->handle() == nullptr)
        return eglDisplay();
    else if (window->supportsOpenGL())
        return static_cast<QXcbEglWindow *>(window->handle())->glIntegration()->eglDisplay();
    return nullptr;
}